

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix4d>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  size_type sVar3;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RAX;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  pointer piVar9;
  long lVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  ulong *puVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  unexpected_type<const_char_*> local_98;
  undefined8 local_90;
  ulong local_88;
  long lStack_80;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  bVar19 = 0;
  if (dest == (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)0x0)
  {
    local_98.m_error = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_98);
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)extraout_RAX;
  }
  piVar9 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar9 == piVar2) {
    pvVar6 = std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
             operator=(dest,values);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71((int7)((ulong)pvVar6 >> 8),1);
  }
  if (elementSize == 0) {
LAB_0017b347:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_RAX;
  }
  uVar5 = (long)(values->
                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(values->
                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                )._M_impl.super__Vector_impl_data._M_start >> 7;
  uVar18 = (ulong)elementSize;
  in_RAX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar5 / uVar18);
  if (uVar5 % uVar18 != 0) goto LAB_0017b347;
  std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::resize
            (dest,((long)piVar2 - (long)piVar9 >> 2) * uVar18);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_98.m_error = (error_type)0x0;
  piVar9 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar9) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
  }
  else {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
    local_78 = __return_storage_ptr__;
    do {
      uVar1 = piVar9[(long)local_98.m_error];
      if (((int)uVar1 < 0) ||
         (uVar5 = ((ulong)uVar1 + 1) * uVar18,
         uVar13 = (long)(values->
                        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(values->
                        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 7,
         uVar13 <= uVar5 && uVar5 - uVar13 != 0)) {
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
        }
        else {
          *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_98.m_error;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        lVar17 = (ulong)uVar1 * uVar18 * 0x80;
        lVar12 = (long)local_98.m_error * uVar18 * 0x80;
        uVar5 = uVar18;
        do {
          puVar14 = (undefined8 *)
                    ((long)((values->
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m[0] + lVar17);
          puVar15 = (undefined8 *)
                    ((long)((dest->
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m[0] + lVar12);
          for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar15 = *puVar14;
            puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          lVar17 = lVar17 + 0x80;
          lVar12 = lVar12 + 0x80;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      peVar4 = local_78;
      local_98.m_error = local_98.m_error + 1;
      piVar9 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_98.m_error <
             (ulong *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
    __return_storage_ptr__ = local_78;
    if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_b8,5);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x247013);
      local_70 = &local_60;
      puVar16 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar16) {
        local_60 = *puVar16;
        lStack_58 = plVar8[3];
        puVar11 = local_70;
      }
      else {
        local_60 = *puVar16;
        puVar11 = (ulong *)*plVar8;
      }
      local_88 = local_60;
      sVar3 = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_98.m_error = (error_type)&local_88;
      if (puVar11 == local_70) {
        lStack_80 = lStack_58;
        puVar11 = (ulong *)local_98.m_error;
      }
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      (peVar4->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar16 = (ulong *)((long)&(peVar4->contained).
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .field_0 + 0x10);
      *(ulong **)
       &(peVar4->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar16;
      if (puVar11 == (ulong *)local_98.m_error) {
        *puVar16 = local_88;
        *(long *)((long)&(peVar4->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = lStack_80;
      }
      else {
        (peVar4->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = (pointer)puVar11;
        *(ulong *)((long)&(peVar4->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10) = local_88;
      }
      (peVar4->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = sVar3;
      local_90 = 0;
      local_88 = local_88 & 0xffffffffffffff00;
      paVar7 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar7) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        paVar7 = extraout_RAX_00;
      }
      goto LAB_0017b592;
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = SUB81(paVar7,0);
LAB_0017b592:
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)paVar7;
  }
  operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)extraout_RAX_01;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}